

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_lzma_codec.cpp
# Opt level: O1

bool __thiscall
crnlib::lzma_codec::unpack(lzma_codec *this,void *p,uint n,vector<unsigned_char> *buf)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  size_t destLen;
  size_t srcLen;
  ulong local_40;
  ulong local_38;
  
  if (buf->m_size != 0) {
    buf->m_size = 0;
  }
  if ((0x13 < n) && ((ushort)(*p << 8 | *p >> 8) == 0x304c)) {
    uVar3 = adler32((uchar *)((long)p + 3),0x11,1);
    if (*(char *)((long)p + 2) == (char)uVar3) {
      uVar5 = *(uint *)((long)p + 0xc);
      uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      if (uVar5 == 0) {
        return true;
      }
      if (0x40000000 < uVar5) {
        return false;
      }
      uVar1 = *(uint *)((long)p + 8);
      if (((uVar1 >> 0x18 == 0 && (uVar1 & 0xff0000) == 0) && (uVar1 & 0xff00) == 0) &&
          (uVar1 & 0xff) == 0) {
        return false;
      }
      uVar1 = buf->m_size;
      if (uVar1 != uVar5) {
        if (uVar1 <= uVar5) {
          if ((buf->m_capacity < uVar5) &&
             (bVar2 = elemental_vector::increase_capacity
                                ((elemental_vector *)buf,uVar5,uVar1 + 1 == uVar5,1,
                                 (object_mover)0x0,true), !bVar2)) {
            return false;
          }
          memset(buf->m_p + buf->m_size,0,(ulong)(uVar5 - buf->m_size));
        }
        buf->m_size = uVar5;
      }
      local_38 = (ulong)n - 0x14;
      uVar5 = *(uint *)((long)p + 8);
      if ((uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18) <=
          local_38) {
        uVar5 = *(uint *)((long)p + 0xc);
        local_40 = (ulong)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                          uVar5 << 0x18);
        iVar4 = (*this->m_pUncompress)
                          (buf->m_p,&local_40,(uchar *)((long)p + 0x14),&local_38,
                           (uchar *)((long)p + 3),5);
        if ((iVar4 == 0) &&
           (uVar5 = *(uint *)((long)p + 0xc),
           local_40 ==
           (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18))) {
          uVar3 = adler32(buf->m_p,(ulong)buf->m_size,1);
          uVar5 = *(uint *)((long)p + 0x10);
          if (uVar3 == (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                       uVar5 << 0x18)) {
            return true;
          }
        }
        if (buf->m_p != (uchar *)0x0) {
          crnlib_free(buf->m_p);
          buf->m_p = (uchar *)0x0;
          buf->m_size = 0;
          buf->m_capacity = 0;
        }
      }
    }
  }
  return false;
}

Assistant:

bool lzma_codec::unpack(const void* p, uint n, crnlib::vector<uint8>& buf)
    {
        buf.resize(0);

        if (n < sizeof(header))
        {
            return false;
        }

        const header& hdr = *static_cast<const header*>(p);
        if (hdr.m_sig != header::cSig)
        {
            return false;
        }

        if (static_cast<uint8>(adler32((const uint8*)&hdr + header::cChecksumSkipBytes, sizeof(hdr) - header::cChecksumSkipBytes)) != hdr.m_checksum)
        {
            return false;
        }

        if (!hdr.m_uncomp_size)
        {
            return true;
        }

        if (!hdr.m_comp_size)
        {
            return false;
        }

        if (hdr.m_uncomp_size > 1024U * 1024U * 1024U)
        {
            return false;
        }

        if (!buf.try_resize(hdr.m_uncomp_size))
        {
            return false;
        }

        const uint8* pComp_data = static_cast<const uint8*>(p) + sizeof(header);
        size_t srcLen = n - sizeof(header);
        if (srcLen < hdr.m_comp_size)
        {
            return false;
        }

        size_t destLen = hdr.m_uncomp_size;

        int status = (*m_pUncompress)(&buf[0], &destLen, pComp_data, &srcLen, hdr.m_lzma_props, cLZMAPropsSize);

        if ((status != SZ_OK) || (destLen != hdr.m_uncomp_size))
        {
            buf.clear();
            return false;
        }

        if (adler32(&buf[0], buf.size()) != hdr.m_adler32)
        {
            buf.clear();
            return false;
        }

        return true;
    }